

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::update
          (TypedTimeSamples<tinyusdz::value::normal3f> *this)

{
  iterator iVar1;
  iterator iVar2;
  TypedTimeSamples<tinyusdz::value::normal3f> *this_local;
  
  iVar1 = std::
          vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
          ::begin(&this->_samples);
  iVar2 = std::
          vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
          ::end(&this->_samples);
  std::
  sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample*,std::vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>>>,tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::update()const::_lambda(tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample_const&,tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample_const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }